

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.cpp
# Opt level: O3

Type * __thiscall
spvtools::opt::CombineAccessChains::GetIndexedType(CombineAccessChains *this,Instruction *inst)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  TypeManager *this_01;
  short sVar2;
  uint32_t uVar3;
  int iVar4;
  Instruction *pIVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Constant *constant_inst;
  uint uVar7;
  ConstantManager *this_02;
  IRContext *this_03;
  uint32_t i;
  uint uVar8;
  uint32_t index_value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> element_indices;
  uint local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  Type *local_40;
  TypeManager *local_38;
  
  pIVar1 = (this->super_Pass).context_;
  sVar2 = (short)pIVar1->valid_analyses_;
  this_03 = pIVar1;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
    this_03 = (this->super_Pass).context_;
    sVar2 = (short)this_03->valid_analyses_;
  }
  this_00 = (pIVar1->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  if (-1 < sVar2) {
    IRContext::BuildTypeManager(this_03);
  }
  this_01 = (this_03->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  uVar3 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar3 = (uint)inst->has_result_id_;
  }
  uVar3 = Instruction::GetSingleWordOperand(inst,uVar3);
  pIVar5 = analysis::DefUseManager::GetDef(this_00,uVar3);
  uVar3 = 0;
  if (pIVar5->has_type_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(pIVar5,0);
  }
  local_38 = this_01;
  pTVar6 = analysis::TypeManager::GetType(this_01,uVar3);
  iVar4 = (*pTVar6->_vptr_Type[0x22])(pTVar6);
  if (CONCAT44(extraout_var,iVar4) == 0) {
    __assert_fail("type->AsPointer()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/combine_access_chains.cpp"
                  ,0x62,
                  "const analysis::Type *spvtools::opt::CombineAccessChains::GetIndexedType(Instruction *)"
                 );
  }
  iVar4 = (*pTVar6->_vptr_Type[0x22])(pTVar6);
  local_40 = *(Type **)(CONCAT44(extraout_var_00,iVar4) + 0x28);
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  uVar8 = (uint)(inst->opcode_ == OpInBoundsPtrAccessChain || inst->opcode_ == OpPtrAccessChain);
  do {
    while( true ) {
      uVar8 = uVar8 + 1;
      uVar7 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar7 = (uint)inst->has_result_id_;
      }
      if ((int)((ulong)((long)(inst->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(inst->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar7
          <= uVar8) {
        pTVar6 = analysis::TypeManager::GetMemberType(local_38,local_40,&local_58);
        if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        return pTVar6;
      }
      uVar3 = Instruction::GetSingleWordOperand(inst,uVar7 + uVar8);
      pIVar5 = analysis::DefUseManager::GetDef(this_00,uVar3);
      pIVar1 = (this->super_Pass).context_;
      if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
        IRContext::BuildConstantManager(pIVar1);
      }
      this_02 = (pIVar1->constant_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                _M_head_impl;
      constant_inst = analysis::ConstantManager::GetConstantFromInst(this_02,pIVar5);
      if (constant_inst == (Constant *)0x0) break;
      local_5c = GetConstantValue((CombineAccessChains *)this_02,constant_inst);
      if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,
                   (iterator)
                   local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_5c);
      }
      else {
        *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_5c;
LAB_005714e5:
        local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    local_5c = 0;
    if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      goto LAB_005714e5;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_58,
               (iterator)
               local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_5c);
  } while( true );
}

Assistant:

const analysis::Type* CombineAccessChains::GetIndexedType(Instruction* inst) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();

  Instruction* base_ptr = def_use_mgr->GetDef(inst->GetSingleWordInOperand(0));
  const analysis::Type* type = type_mgr->GetType(base_ptr->type_id());
  assert(type->AsPointer());
  type = type->AsPointer()->pointee_type();
  std::vector<uint32_t> element_indices;
  uint32_t starting_index = 1;
  if (IsPtrAccessChain(inst->opcode())) {
    // Skip the first index of OpPtrAccessChain as it does not affect type
    // resolution.
    starting_index = 2;
  }
  for (uint32_t i = starting_index; i < inst->NumInOperands(); ++i) {
    Instruction* index_inst =
        def_use_mgr->GetDef(inst->GetSingleWordInOperand(i));
    const analysis::Constant* index_constant =
        context()->get_constant_mgr()->GetConstantFromInst(index_inst);
    if (index_constant) {
      uint32_t index_value = GetConstantValue(index_constant);
      element_indices.push_back(index_value);
    } else {
      // This index must not matter to resolve the type in valid SPIR-V.
      element_indices.push_back(0);
    }
  }
  type = type_mgr->GetMemberType(type, element_indices);
  return type;
}